

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::GenerateByteSize
          (RepeatedPrimitive *this,Printer *p)

{
  undefined1 *puVar1;
  bool bVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  long lVar4;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  undefined1 *apuStack_210 [2];
  long alStack_200 [2];
  anon_class_1_0_00000001 local_1e9;
  undefined1 local_1e8 [32];
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  Printer *local_1a8;
  undefined1 local_1a0 [40];
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  alStack_200[0] = 0x30c709;
  local_1a8 = p;
  bVar2 = HasCachedSize(this);
  if (!bVar2) {
    alStack_200[0] = 0x30c76b;
    local_1c8 = &local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"data_size","");
    local_1a0._0_8_ = local_1a0 + 0x10;
    if (local_1c8 == &local_1b8) {
      local_1a0._24_8_ = uStack_1b0;
    }
    else {
      local_1a0._0_8_ = local_1c8;
    }
    local_1a0._8_8_ = local_1c0;
    local_1c0 = 0;
    local_1b8 = 0;
    alStack_200[0] = 0x30c7c0;
    local_1c8 = &local_1b8;
    local_1a0._32_8_ = operator_new(0x18);
    *(RepeatedPrimitive **)local_1a0._32_8_ = this;
    *(Printer ***)(local_1a0._32_8_ + 8) = &local_1a8;
    *(undefined1 *)(local_1a0._32_8_ + 0x10) = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_178 = 0;
    local_170 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_160 = 1;
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    alStack_200[0] = 0x30c830;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x522f0c);
    local_f0 = 0;
    puVar1 = local_1e8 + 0x10;
    alStack_200[0] = 0x30c85d;
    local_1e8._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"tag_size","");
    local_e8 = local_d8;
    if ((undefined1 *)local_1e8._0_8_ == puVar1) {
      uStack_d0 = local_1e8._24_8_;
    }
    else {
      local_e8 = (undefined1 *)local_1e8._0_8_;
    }
    local_e0 = local_1e8._8_8_;
    local_1e8._8_8_ = 0;
    local_1e8[0x10] = 0;
    alStack_200[0] = 0x30c8bf;
    local_1e8._0_8_ = puVar1;
    local_c8 = (undefined8 *)operator_new(0x18);
    *local_c8 = this;
    local_c8[1] = &local_1a8;
    *(undefined1 *)(local_c8 + 2) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_c0 = 0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    alStack_200[0] = 0x30c92f;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
    local_38 = 0;
    alStack_200[0] = 0x30c959;
    io::Printer::Emit(p,local_1a0,2,0x85,
                      "\n        ::size_t data_size = $data_size$;\n        ::size_t tag_size = $tag_size$;\n        total_size += tag_size + data_size;\n      "
                     );
    lVar4 = 0x170;
    do {
      if (*(char *)((long)&local_1a8 + lVar4) == '\x01') {
        alStack_200[0] = 0x30c980;
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_1e8 + lVar4));
      }
      if ((long *)((long)alStack_200 + lVar4) != *(long **)((long)apuStack_210 + lVar4)) {
        alStack_200[0] = 0x30c99c;
        operator_delete(*(long **)((long)apuStack_210 + lVar4),
                        *(long *)((long)alStack_200 + lVar4) + 1);
      }
      alStack_200[0] = 0x30c9af;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)apuStack_210 + lVar4 + -8)]._M_data)
                (&local_1e9,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)((long)&vStack_238.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + lVar4));
      plVar3 = (long *)((long)alStack_258 + lVar4 + 0x10);
      *(undefined1 *)((long)apuStack_210 + lVar4 + -8) = 0xff;
      if (plVar3 != *(long **)((long)alStack_258 + lVar4)) {
        alStack_200[0] = 0x30c9cf;
        operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar3 + 1);
      }
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != 0);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      alStack_200[0] = 0x30c9f4;
      operator_delete((void *)local_1e8._0_8_,CONCAT71(local_1e8._17_7_,local_1e8[0x10]) + 1);
    }
    if (local_1c8 != &local_1b8) {
      alStack_200[0] = 0x30ca0b;
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    return;
  }
  alStack_200[0] = 0x30c716;
  bVar2 = FieldDescriptor::is_packed((this->super_FieldGeneratorBase).field_);
  if (!bVar2) {
    alStack_200[0] = 0x30ca27;
    cpp::(anonymous_namespace)::RepeatedPrimitive::GenerateByteSize();
    lVar4 = 0xb8;
    do {
      alStack_200[0] = 0x30ca44;
      io::Printer::Sub::~Sub((Sub *)(local_1a0 + lVar4));
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != -0xb8);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      alStack_200[0] = 0x30cac4;
      operator_delete((void *)local_1e8._0_8_,CONCAT71(local_1e8._17_7_,local_1e8[0x10]) + 1);
    }
    if (local_1c8 != &local_1b8) {
      alStack_200[0] = 0x30cb35;
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    alStack_200[0] = (long)&LAB_0030cb61;
    _Unwind_Resume(extraout_RAX);
  }
  io::Printer::Emit(p,0,0,0xda,
                    "\n          total_size +=\n              ::_pbi::WireFormatLite::$DeclaredType$SizeWithPackedTagSize(\n                  this_._internal_$name$(), $kTagBytes$,\n                  this_.$_field_cached_byte_size_$);\n        "
                   );
  return;
}

Assistant:

void RepeatedPrimitive::GenerateByteSize(io::Printer* p) const {
  if (HasCachedSize()) {
    ABSL_CHECK(field_->is_packed());
    p->Emit(
        R"cc(
          total_size +=
              ::_pbi::WireFormatLite::$DeclaredType$SizeWithPackedTagSize(
                  this_._internal_$name$(), $kTagBytes$,
                  this_.$_field_cached_byte_size_$);
        )cc");
    return;
  }
  p->Emit(
      {
          {"data_size",
           [&] {
             auto fixed_size = FixedSize(field_->type());
             if (fixed_size.has_value()) {
               p->Emit({{"kFixed", *fixed_size}}, R"cc(
                 ::size_t{$kFixed$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             } else {
               p->Emit(R"cc(
                 ::_pbi::WireFormatLite::$DeclaredType$Size(
                     this_._internal_$name$());
               )cc");
             }
           }},
          {"tag_size",
           [&] {
             if (field_->is_packed()) {
               p->Emit(R"cc(
                 data_size == 0
                     ? 0
                     : $kTagBytes$ + ::_pbi::WireFormatLite::Int32Size(
                                         static_cast<::int32_t>(data_size));
               )cc");
             } else {
               p->Emit(R"cc(
                 ::size_t{$kTagBytes$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             }
           }},
      },
      R"cc(
        ::size_t data_size = $data_size$;
        ::size_t tag_size = $tag_size$;
        total_size += tag_size + data_size;
      )cc");
}